

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O3

string * __thiscall
cmsys::SystemInformation::GetCPUDescription_abi_cxx11_
          (string *__return_storage_ptr__,SystemInformation *this)

{
  pointer pcVar1;
  char *pcVar2;
  long lVar3;
  ostream *poVar4;
  size_t sVar5;
  ulong uVar6;
  ostringstream oss;
  long *local_1b8;
  long local_1b0;
  long local_1a8 [2];
  undefined1 local_198 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," core ",6);
  pcVar1 = (this->Implementation->ChipID).ModelName._M_dataplus._M_p;
  local_1b8 = local_1a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b8,pcVar1,
             pcVar1 + (this->Implementation->ChipID).ModelName._M_string_length);
  lVar3 = local_1b0;
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8,local_1a8[0] + 1);
  }
  if (lVar3 == 0) {
    poVar4 = std::ostream::_M_insert<double>((double)this->Implementation->CPUSpeedInMHz);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," MHz ",5);
    pcVar2 = (this->Implementation->ChipID).Vendor._M_dataplus._M_p;
    if (pcVar2 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)poVar4->_vptr_basic_ostream[-3]);
    }
    else {
      sVar5 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar2,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    pcVar2 = (this->Implementation->ChipID).ProcessorName._M_dataplus._M_p;
    if (pcVar2 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)poVar4->_vptr_basic_ostream[-3]);
    }
    else {
      sVar5 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar2,sVar5);
    }
  }
  else {
    pcVar1 = (this->Implementation->ChipID).ModelName._M_dataplus._M_p;
    local_1b8 = local_1a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1b8,pcVar1,
               pcVar1 + (this->Implementation->ChipID).ModelName._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,(char *)local_1b8,local_1b0);
    if (local_1b8 != local_1a8) {
      operator_delete(local_1b8,local_1a8[0] + 1);
    }
  }
  std::__cxx11::stringbuf::str();
  while( true ) {
    uVar6 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x5c7881,0);
    if (uVar6 == 0xffffffffffffffff) break;
    std::__cxx11::string::replace((ulong)__return_storage_ptr__,uVar6,(char *)0x2,0x5bc68f);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string SystemInformation::GetCPUDescription()
{
  std::ostringstream oss;
  oss
    << this->GetNumberOfPhysicalCPU()
    << " core ";
  if (this->GetModelName().empty())
    {
    oss
      << this->GetProcessorClockFrequency()
      << " MHz "
      << this->GetVendorString()
      << " "
      << this->GetExtendedProcessorName();
    }
  else
    {
    oss << this->GetModelName();
    }

  // remove extra spaces
  std::string tmp=oss.str();
  size_t pos;
  while( (pos=tmp.find("  "))!=std::string::npos)
    {
    tmp.replace(pos,2," ");
    }

  return tmp;
}